

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesCMakeSystemVariable(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmSearchPath *pcVar2;
  bool bVar3;
  __type _Var4;
  ulong uVar5;
  string *psVar6;
  bool local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  bool local_2e2;
  string local_2c8;
  allocator<char> local_2a1;
  undefined1 local_2a0 [8];
  string debugBuffer;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  byte local_1b1;
  reference pbStack_1b0;
  bool to_add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  long count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  iterator local_160;
  size_type local_158;
  undefined1 local_150 [8];
  cmList expanded;
  string local_130;
  cmValue local_110;
  cmValue prefix_paths;
  string local_100;
  cmValue local_e0;
  cmValue install_value;
  string local_d0;
  cmValue local_b0;
  cmValue to_skip;
  string install_path_to_remove;
  long install_prefix_count;
  string local_78;
  byte local_56;
  byte local_55;
  bool add_install_prefix;
  bool remove_install_prefix;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  mapped_type *pmStack_18;
  bool install_prefix_in_list;
  cmSearchPath *paths;
  cmFindPackageCommand *this_local;
  
  paths = (cmSearchPath *)this;
  pmStack_18 = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &cmFindCommon::PathLabel::CMakeSystem);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_FIND_NO_INSTALL_PREFIX",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = (bVar3 ^ 0xffU) & 1;
  local_55 = (this->super_cmFindCommon).NoCMakeInstallPath & 1;
  install_prefix_count._6_1_ = 0;
  install_prefix_count._5_1_ = 0;
  local_2e2 = false;
  if (((this->super_cmFindCommon).NoCMakeInstallPath & 1U) == 0) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    install_prefix_count._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_FIND_USE_INSTALL_PREFIX",
               (allocator<char> *)((long)&install_prefix_count + 7));
    install_prefix_count._5_1_ = 1;
    local_2e2 = cmMakefile::IsDefinitionSet(pcVar1,&local_78);
  }
  if ((install_prefix_count._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((install_prefix_count._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&install_prefix_count + 7));
  }
  local_56 = local_2e2;
  install_path_to_remove.field_2._8_8_ = 0xffffffffffffffff;
  std::__cxx11::string::string((string *)&to_skip);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT",
             (allocator<char> *)((long)&install_value.Value + 7));
  local_b0 = cmMakefile::GetDefinition(pcVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&install_value.Value + 7));
  bVar3 = cmValue::operator_cast_to_bool(&local_b0);
  if (bVar3) {
    psVar6 = cmValue::operator*[abi_cxx11_(&local_b0);
    cmStrToLong(psVar6,(long *)(install_path_to_remove.field_2._M_local_buf + 8));
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE",
             (allocator<char> *)((long)&prefix_paths.Value + 7));
  local_e0 = cmMakefile::GetDefinition(pcVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&prefix_paths.Value + 7));
  bVar3 = cmValue::operator_cast_to_bool(&local_e0);
  if (bVar3) {
    psVar6 = cmValue::operator*[abi_cxx11_(&local_e0);
    std::__cxx11::string::operator=((string *)&to_skip,(string *)psVar6);
  }
  if (((((local_55 & 1) == 0) || ((local_19 & 1) == 0)) ||
      ((long)install_path_to_remove.field_2._8_8_ < 1)) ||
     (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
    pcVar2 = pmStack_18;
    if (((local_56 & 1) == 0) || ((local_19 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"CMAKE_SYSTEM_PREFIX_PATH",&local_229);
      cmSearchPath::AddCMakePath(pcVar2,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"CMAKE_INSTALL_PREFIX",&local_1d9);
      cmSearchPath::AddCMakePath(pcVar2,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      pcVar2 = pmStack_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"CMAKE_SYSTEM_PREFIX_PATH",&local_201);
      cmSearchPath::AddCMakePath(pcVar2,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
    }
  }
  else {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"CMAKE_SYSTEM_PREFIX_PATH",
               (allocator<char> *)
               ((long)&expanded.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_110 = cmMakefile::GetDefinition(pcVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&expanded.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar6 = cmValue::operator*[abi_cxx11_(&local_110);
    std::__cxx11::string::string((string *)&local_180,(string *)psVar6);
    local_160 = &local_180;
    local_158 = 1;
    init._M_len = 1;
    init._M_array = local_160;
    cmList::cmList((cmList *)local_150,init);
    local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160;
    do {
      local_358 = local_358 + -1;
      std::__cxx11::string::~string((string *)local_358);
    } while (local_358 != &local_180);
    __range2 = (cmList *)0x0;
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_150);
    path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmList::end_abi_cxx11_((cmList *)local_150);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar3) {
      pbStack_1b0 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
      _Var4 = std::operator==(pbStack_1b0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &to_skip);
      local_369 = false;
      if (_Var4) {
        __range2 = (cmList *)
                   ((long)&(__range2->Values).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
        local_369 = __range2 == (cmList *)install_path_to_remove.field_2._8_8_;
      }
      local_1b1 = (local_369 ^ 0xffU) & 1;
      if (local_1b1 != 0) {
        cmSearchPath::AddPath(pmStack_18,pbStack_1b0);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)local_150);
  }
  pcVar2 = pmStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"CMAKE_SYSTEM_FRAMEWORK_PATH",&local_251);
  cmSearchPath::AddCMakePath(pcVar2,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  pcVar2 = pmStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"CMAKE_SYSTEM_APPBUNDLE_PATH",
             (allocator<char> *)(debugBuffer.field_2._M_local_buf + 0xf));
  cmSearchPath::AddCMakePath(pcVar2,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)(debugBuffer.field_2._M_local_buf + 0xf));
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a0,
               "CMake variables defined in the Platform file [CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n",
               &local_2a1);
    std::allocator<char>::~allocator(&local_2a1);
    anon_unknown.dwarf_97ced1::collectPathsForDebug((string *)local_2a0,pmStack_18,0);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              (&local_2c8,&this->DebugBuffer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  std::__cxx11::string::~string((string *)&to_skip);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeSystemVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake
  long install_prefix_count = -1;
  std::string install_path_to_remove;
  if (cmValue to_skip = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT")) {
    cmStrToLong(*to_skip, &install_prefix_count);
  }
  if (cmValue install_value = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE")) {
    install_path_to_remove = *install_value;
  }

  if (remove_install_prefix && install_prefix_in_list &&
      install_prefix_count > 0 && !install_path_to_remove.empty()) {

    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");
    // remove entry from CMAKE_SYSTEM_PREFIX_PATH
    cmList expanded{ *prefix_paths };
    long count = 0;
    for (const auto& path : expanded) {
      bool const to_add =
        !(path == install_path_to_remove && ++count == install_prefix_count);
      if (to_add) {
        paths.AddPath(path);
      }
    }
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");

  if (this->DebugMode) {
    std::string debugBuffer = "CMake variables defined in the Platform file "
                              "[CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}